

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

void __thiscall pbrt::AsyncJob<pbrt::Light>::DoWork(AsyncJob<pbrt::Light> *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  char (*in_stack_00000010) [20];
  unique_lock<std::mutex> l;
  Light r;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  function<pbrt::Light_()> *in_stack_ffffffffffffffd8;
  
  std::function<pbrt::Light_()>::operator()(in_stack_ffffffffffffffd8);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  bVar1 = pstd::optional<pbrt::Light>::has_value((optional<pbrt::Light> *)(in_RDI + 2));
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    pstd::optional<pbrt::Light>::operator=
              ((optional<pbrt::Light> *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),(Light *)in_RDI);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)CONCAT44(in_stack_ffffffffffffffd4,uVar2));
    return;
  }
  LogFatal<char_const(&)[20]>
            (this._4_4_,
             (char *)r.
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     .bits,l._12_4_,(char *)l._M_device,in_stack_00000010);
}

Assistant:

void DoWork() {
        T r = func();
        std::unique_lock<std::mutex> l(mutex);
        CHECK(!result.has_value());
        result = r;
        cv.notify_all();
    }